

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_cubic_to
               (plutovg_path_t *path,float x1,float y1,float x2,float y2,float x3,float y3)

{
  plutovg_path_element_t pVar1;
  plutovg_path_element_t pVar2;
  plutovg_path_element_t pVar3;
  plutovg_path_element_t *ppVar4;
  plutovg_path_element_t *elements;
  float y3_local;
  float x3_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  plutovg_path_t *path_local;
  
  if ((path->elements).size == 0) {
    plutovg_path_move_to(path,0.0,0.0);
  }
  ppVar4 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CUBIC_TO,3);
  pVar3.point.y = y1;
  pVar3.point.x = x1;
  *ppVar4 = pVar3;
  pVar2.point.y = y2;
  pVar2.point.x = x2;
  ppVar4[1] = pVar2;
  pVar1.point.y = y3;
  pVar1.point.x = x3;
  ppVar4[2] = pVar1;
  path->num_curves = path->num_curves + 1;
  return;
}

Assistant:

void plutovg_path_cubic_to(plutovg_path_t* path, float x1, float y1, float x2, float y2, float x3, float y3)
{
    if(path->elements.size == 0)
        plutovg_path_move_to(path, 0, 0);
    plutovg_path_element_t* elements = plutovg_path_add_command(path, PLUTOVG_PATH_COMMAND_CUBIC_TO, 3);
    elements[0].point = PLUTOVG_MAKE_POINT(x1, y1);
    elements[1].point = PLUTOVG_MAKE_POINT(x2, y2);
    elements[2].point = PLUTOVG_MAKE_POINT(x3, y3);
    path->num_curves += 1;
}